

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000018d180 = 0x2d2d2d2d2d2d2d;
    uRam000000000018d187._0_1_ = '-';
    uRam000000000018d187._1_1_ = '-';
    uRam000000000018d187._2_1_ = '-';
    uRam000000000018d187._3_1_ = '-';
    uRam000000000018d187._4_1_ = '-';
    uRam000000000018d187._5_1_ = '-';
    uRam000000000018d187._6_1_ = '-';
    uRam000000000018d187._7_1_ = '-';
    DAT_0018d170 = '-';
    DAT_0018d170_1._0_1_ = '-';
    DAT_0018d170_1._1_1_ = '-';
    DAT_0018d170_1._2_1_ = '-';
    DAT_0018d170_1._3_1_ = '-';
    DAT_0018d170_1._4_1_ = '-';
    DAT_0018d170_1._5_1_ = '-';
    DAT_0018d170_1._6_1_ = '-';
    uRam000000000018d178 = 0x2d2d2d2d2d2d2d;
    DAT_0018d17f = 0x2d;
    DAT_0018d160 = '-';
    DAT_0018d160_1._0_1_ = '-';
    DAT_0018d160_1._1_1_ = '-';
    DAT_0018d160_1._2_1_ = '-';
    DAT_0018d160_1._3_1_ = '-';
    DAT_0018d160_1._4_1_ = '-';
    DAT_0018d160_1._5_1_ = '-';
    DAT_0018d160_1._6_1_ = '-';
    uRam000000000018d168._0_1_ = '-';
    uRam000000000018d168._1_1_ = '-';
    uRam000000000018d168._2_1_ = '-';
    uRam000000000018d168._3_1_ = '-';
    uRam000000000018d168._4_1_ = '-';
    uRam000000000018d168._5_1_ = '-';
    uRam000000000018d168._6_1_ = '-';
    uRam000000000018d168._7_1_ = '-';
    DAT_0018d150 = '-';
    DAT_0018d150_1._0_1_ = '-';
    DAT_0018d150_1._1_1_ = '-';
    DAT_0018d150_1._2_1_ = '-';
    DAT_0018d150_1._3_1_ = '-';
    DAT_0018d150_1._4_1_ = '-';
    DAT_0018d150_1._5_1_ = '-';
    DAT_0018d150_1._6_1_ = '-';
    uRam000000000018d158._0_1_ = '-';
    uRam000000000018d158._1_1_ = '-';
    uRam000000000018d158._2_1_ = '-';
    uRam000000000018d158._3_1_ = '-';
    uRam000000000018d158._4_1_ = '-';
    uRam000000000018d158._5_1_ = '-';
    uRam000000000018d158._6_1_ = '-';
    uRam000000000018d158._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000018d148._0_1_ = '-';
    uRam000000000018d148._1_1_ = '-';
    uRam000000000018d148._2_1_ = '-';
    uRam000000000018d148._3_1_ = '-';
    uRam000000000018d148._4_1_ = '-';
    uRam000000000018d148._5_1_ = '-';
    uRam000000000018d148._6_1_ = '-';
    uRam000000000018d148._7_1_ = '-';
    DAT_0018d18f = 0;
  }
  uStack_18 = in_RAX;
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}